

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>::Data
          (Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *this,
          Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *other,
          size_t reserved)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  GestureType *pGVar4;
  long in_RSI;
  Span<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar5;
  size_t otherNSpans;
  Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *newNode;
  Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *this_00;
  GestureType *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  GestureType *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  ((QHash<QWidget_*,_QGesture_*> *)((long)in_RDI->offsets + 8))->d = *(Data **)(in_RSI + 8);
  *(undefined8 *)((long)in_RDI->offsets + 0x10) = 0;
  *(undefined8 *)((long)in_RDI->offsets + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 *)((long)in_RDI->offsets + 0x20) = 0;
  qMax<unsigned_long>((unsigned_long *)((long)in_RDI->offsets + 8),&local_20);
  sVar3 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  *(size_t *)((long)in_RDI->offsets + 0x10) = sVar3;
  RVar5 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)((long)in_RDI->offsets + 0x20) = RVar5.spans;
  pGVar4 = (GestureType *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = pGVar4;
  for (local_40 = (GestureType *)0x0; local_40 < pGVar4;
      local_40 = (GestureType *)((long)local_40 + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>::hasNode
                        ((Span<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>
                          *)(lVar1 + (long)local_40 * 0x90),i);
      if (bVar2) {
        Span<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>::at
                  (this_00,(size_t)in_RDI);
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = findBucket<Qt::GestureType>
                             ((Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_>
                               *)RVar5.spans,key);
        Bucket::insert((Bucket *)0x32a967);
        Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::Node
                  ((Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *)this_00,
                   (Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }